

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O3

char * mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::GetTypeName(void)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()::
      name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                                 GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"ComplementarityConstraint[","");
      AlgebraicExpression<mp::LinTerms>::GetTypeName_abi_cxx11_();
      std::operator+(&local_30,&local_70,&local_50);
      std::operator+(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                      GetTypeName()::name_abi_cxx11_,&local_30,']');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()
                    ::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                           GetTypeName()::name_abi_cxx11_);
    }
  }
  return ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()::
         name_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

static const char* GetTypeName() {
    static std::string name
      { std::string("ComplementarityConstraint[") +
          Expr::GetTypeName() + ']' };
    return name.c_str();
  }